

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void __thiscall mp::Error::Error(Error *this,CStringRef msg,int c)

{
  allocator<char> local_39;
  string local_38;
  
  fmt::internal::RuntimeError::RuntimeError(&this->super_RuntimeError);
  *(undefined ***)&this->super_RuntimeError = &PTR__SystemError_0014ca78;
  this->exit_code_ = c;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,msg.data_,&local_39);
  SetMessage(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Error(fmt::CStringRef msg, int c=-1) : exit_code_(c)
  { SetMessage(msg.c_str()); }